

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O3

void qDrawShadePanel(QPainter *p,int x,int y,int w,int h,QPalette *pal,bool sunken,int lineWidth,
                    QBrush *fill)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  uint uVar7;
  ColorGroup CVar8;
  long in_FS_OFFSET;
  ulong uVar9;
  double dVar10;
  double dVar11;
  int iVar12;
  int iVar13;
  double dVar14;
  int local_e8;
  int iStack_e4;
  int local_d8;
  int iStack_d4;
  QLineF local_98;
  QList<QLineF> local_78;
  QColor local_58;
  QColor local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (h != 0 && w != 0) {
    if ((h | w | lineWidth) < 0) {
      qDrawShadePanel();
    }
    QPainter::save();
    QPainter::device();
    dVar10 = (double)QPaintDevice::devicePixelRatio();
    dVar11 = dVar10 + -1.0;
    uVar9 = -(ulong)(dVar11 < -dVar11);
    dVar11 = (double)(~uVar9 & (ulong)dVar11 | (ulong)-dVar11 & uVar9) * 1000000000000.0;
    uVar9 = -(ulong)(dVar10 < -dVar10);
    dVar14 = (double)(~uVar9 & (ulong)dVar10 | (ulong)-dVar10 & uVar9);
    if (1.0 <= dVar14) {
      dVar14 = 1.0;
    }
    local_e8 = x;
    iStack_e4 = y;
    local_d8 = w;
    iStack_d4 = h;
    if (dVar14 < dVar11) {
      QPainter::scale(1.0 / dVar10,1.0 / dVar10);
      local_e8 = (int)((double)((ulong)((double)x * dVar10) & 0x8000000000000000 |
                               0x3fe0000000000000) + (double)x * dVar10);
      iStack_e4 = (int)((double)((ulong)((double)y * dVar10) & 0x8000000000000000 |
                                0x3fe0000000000000) + (double)y * dVar10);
      local_d8 = (int)((double)w * dVar10);
      iStack_d4 = (int)((double)h * dVar10);
      lineWidth = (int)((double)((ulong)((double)lineWidth * dVar10) & 0x8000000000000000 |
                                0x3fe0000000000000) + (double)lineWidth * dVar10);
      local_98.pt1.xp = 0.5;
      local_98.pt1.yp = 0.5;
      QPainter::translate((QPointF *)p);
    }
    local_48._0_6_ = 0xaaaaaaaaaaaa;
    local_48.ct.argb.red = 0xaaaa;
    local_48.ct._4_6_ = 0xaaaaaaaaaaaa;
    local_48._14_2_ = 0xaaaa;
    CVar8 = (ColorGroup)pal;
    plVar6 = (long *)QPalette::brush(CVar8,Dark);
    uVar1 = *(undefined8 *)(*plVar6 + 8);
    uVar2 = *(undefined8 *)(*plVar6 + 0x10);
    local_48._0_6_ = SUB86(uVar1,0);
    local_48.ct.argb.red = (ushort)((ulong)uVar1 >> 0x30);
    local_48.ct._4_6_ = (undefined6)uVar2;
    local_48._14_2_ = SUB82((ulong)uVar2 >> 0x30,0);
    local_58._0_6_ = 0xaaaaaaaaaaaa;
    local_58.ct.argb.red = 0xaaaa;
    local_58.ct._4_6_ = 0xaaaaaaaaaaaa;
    local_58._14_2_ = 0xaaaa;
    plVar6 = (long *)QPalette::brush(CVar8,Dark);
    uVar1 = *(undefined8 *)(*plVar6 + 8);
    uVar2 = *(undefined8 *)(*plVar6 + 0x10);
    local_58._0_6_ = SUB86(uVar1,0);
    local_58.ct.argb.red = (ushort)((ulong)uVar1 >> 0x30);
    local_58.ct._4_6_ = (undefined6)uVar2;
    local_58._14_2_ = SUB82((ulong)uVar2 >> 0x30,0);
    if (fill != (QBrush *)0x0) {
      cVar3 = QColor::operator==((QColor *)(*(long *)fill + 8),&local_48);
      if (cVar3 != '\0') {
        plVar6 = (long *)QPalette::brush(CVar8,Dark);
        uVar1 = *(undefined8 *)(*plVar6 + 0xe);
        local_48._0_6_ = SUB86(*(undefined8 *)(*plVar6 + 8),0);
        local_48.ct.argb.red = (ushort)uVar1;
        local_48.ct._4_6_ = (undefined6)((ulong)uVar1 >> 0x10);
      }
      cVar3 = QColor::operator==((QColor *)(*(long *)fill + 8),&local_58);
      if (cVar3 != '\0') {
        plVar6 = (long *)QPalette::brush(CVar8,Dark);
        uVar1 = *(undefined8 *)(*plVar6 + 0xe);
        local_58._0_6_ = SUB86(*(undefined8 *)(*plVar6 + 8),0);
        local_58.ct.argb.red = (ushort)uVar1;
        local_58.ct._4_6_ = (undefined6)((ulong)uVar1 >> 0x10);
      }
    }
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = (QLineF *)0x0;
    local_78.d.size = 0;
    QList<QLineF>::reserve(&local_78,(long)(lineWidth * 2));
    QPainter::setPen((QColor *)p);
    iVar12 = iStack_e4 + iStack_d4;
    if (0 < lineWidth) {
      iVar4 = local_e8 + local_d8 + -2;
      iVar13 = iStack_e4;
      uVar7 = lineWidth;
      do {
        local_98.pt1.yp = (qreal)iVar13;
        local_98.pt2.xp = (qreal)iVar4;
        iVar13 = iVar13 + 1;
        iVar4 = iVar4 + -1;
        local_98.pt1.xp = (double)local_e8;
        local_98.pt2.yp = local_98.pt1.yp;
        QtPrivate::QPodArrayOps<QLineF>::emplace<QLineF>
                  ((QPodArrayOps<QLineF> *)&local_78,local_78.d.size,&local_98);
        QList<QLineF>::end(&local_78);
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      if (0 < lineWidth) {
        iVar4 = local_e8;
        uVar7 = lineWidth;
        do {
          local_98.pt1.xp = (qreal)iVar4;
          local_98.pt2.yp = (qreal)iVar13;
          iVar4 = iVar4 + 1;
          iVar13 = iVar13 + -1;
          local_98.pt1.yp = (double)(iVar12 + -2);
          local_98.pt2.xp = local_98.pt1.xp;
          QtPrivate::QPodArrayOps<QLineF>::emplace<QLineF>
                    ((QPodArrayOps<QLineF> *)&local_78,local_78.d.size,&local_98);
          QList<QLineF>::end(&local_78);
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
    }
    QPainter::drawLines((QLineF *)p,(int)local_78.d.ptr);
    QList<QLineF>::clear(&local_78);
    QPainter::setPen((QColor *)p);
    if (0 < lineWidth) {
      iVar5 = local_e8 + local_d8 + -1;
      iVar4 = local_e8;
      iVar13 = iVar12;
      uVar7 = lineWidth;
      do {
        iVar13 = iVar13 + -1;
        local_98.pt1.xp = (qreal)iVar4;
        iVar4 = iVar4 + 1;
        local_98.pt1.yp = (qreal)iVar13;
        local_98.pt2.xp = (double)iVar5;
        local_98.pt2.yp = local_98.pt1.yp;
        QtPrivate::QPodArrayOps<QLineF>::emplace<QLineF>
                  ((QPodArrayOps<QLineF> *)&local_78,local_78.d.size,&local_98);
        QList<QLineF>::end(&local_78);
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      if (0 < lineWidth) {
        iVar13 = iStack_e4;
        uVar7 = lineWidth;
        do {
          local_98.pt1.xp = (qreal)iVar5;
          local_98.pt1.yp = (qreal)iVar13;
          iVar5 = iVar5 + -1;
          iVar13 = iVar13 + 1;
          local_98.pt2.xp = local_98.pt1.xp;
          local_98.pt2.yp = (double)(iVar12 + ~lineWidth);
          QtPrivate::QPodArrayOps<QLineF>::emplace<QLineF>
                    ((QPodArrayOps<QLineF> *)&local_78,local_78.d.size,&local_98);
          QList<QLineF>::end(&local_78);
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
    }
    QPainter::drawLines((QLineF *)p,(int)local_78.d.ptr);
    if (fill != (QBrush *)0x0) {
      if (dVar14 < dVar11) {
        local_98.pt1.xp = -0.5;
        local_98.pt1.yp = -0.5;
        QPainter::translate((QPointF *)p);
      }
      local_98.pt1.xp = (qreal)CONCAT44(iStack_e4 + lineWidth,local_e8 + lineWidth);
      uVar7 = ~(lineWidth * 2);
      local_98.pt1.yp =
           (qreal)CONCAT44(iStack_d4 + uVar7 + iStack_e4 + lineWidth,
                           local_d8 + uVar7 + local_e8 + lineWidth);
      QPainter::fillRect((QRect *)p,(QBrush *)&local_98);
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,0x20,0x10);
      }
    }
    QPainter::restore();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qDrawShadePanel(QPainter *p, int x, int y, int w, int h,
                      const QPalette &pal, bool sunken,
                      int lineWidth, const QBrush *fill)
{
    if (w == 0 || h == 0)
        return;
    if (Q_UNLIKELY(w < 0 || h < 0 || lineWidth < 0)) {
        qWarning("qDrawShadePanel: Invalid parameters");
    }

    QPainterStateGuard painterGuard(p);
    const qreal devicePixelRatio = QStyleHelper::getDpr(p);
    bool isTranslated = false;
    if (!qFuzzyCompare(devicePixelRatio, qreal(1))) {
        const qreal inverseScale = qreal(1) / devicePixelRatio;
        p->scale(inverseScale, inverseScale);
        x = qRound(devicePixelRatio * x);
        y = qRound(devicePixelRatio * y);
        w = devicePixelRatio * w;
        h = devicePixelRatio * h;
        lineWidth = qRound(devicePixelRatio * lineWidth);
        p->translate(0.5, 0.5);
        isTranslated = true;
    }

    QColor shade = pal.dark().color();
    QColor light = pal.light().color();
    if (fill) {
        if (fill->color() == shade)
            shade = pal.shadow().color();
        if (fill->color() == light)
            light = pal.midlight().color();
    }
    QList<QLineF> lines;
    lines.reserve(2*lineWidth);

    if (sunken)
        p->setPen(shade);
    else
        p->setPen(light);
    int x1, y1, x2, y2;
    int i;
    x1 = x;
    y1 = y2 = y;
    x2 = x+w-2;
    for (i=0; i<lineWidth; i++) {                // top shadow
        lines << QLineF(x1, y1++, x2--, y2++);
    }
    x2 = x1;
    y1 = y+h-2;
    for (i=0; i<lineWidth; i++) {                // left shado
        lines << QLineF(x1++, y1, x2++, y2--);
    }
    p->drawLines(lines);
    lines.clear();
    if (sunken)
        p->setPen(light);
    else
        p->setPen(shade);
    x1 = x;
    y1 = y2 = y+h-1;
    x2 = x+w-1;
    for (i=0; i<lineWidth; i++) {                // bottom shadow
        lines << QLineF(x1++, y1--, x2, y2--);
    }
    x1 = x2;
    y1 = y;
    y2 = y+h-lineWidth-1;
    for (i=0; i<lineWidth; i++) {                // right shadow
        lines << QLineF(x1--, y1++, x2--, y2);
    }
    p->drawLines(lines);
    if (fill) {                                // fill with fill color
        if (isTranslated)
            p->translate(-0.5, -0.5);
        p->fillRect(x+lineWidth, y+lineWidth, w-lineWidth*2, h-lineWidth*2, *fill);
    }
}